

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

void __thiscall depspawn::internal::EnvInitClass::EnvInitClass(EnvInitClass *this)

{
  char *pcVar1;
  long lVar2;
  invalid_argument *this_00;
  
  pcVar1 = getenv("DEPSPAWN_NUM_THREADS");
  if (pcVar1 == (char *)0x0) {
    Nthreads = std::thread::hardware_concurrency();
  }
  else {
    lVar2 = strtol(pcVar1,(char **)0x0,0);
    Nthreads = (int)lVar2;
  }
  if (Nthreads < 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid DEPSPAWN_NUM_THREADS");
  }
  else {
    set_threads(Nthreads);
    pcVar1 = getenv("DEPSPAWN_ENQUEUE_TASKS");
    EnqueueTasks = pcVar1 != (char *)0x0;
    pcVar1 = getenv("DEPSPAWN_TASK_QUEUE_LIMIT");
    FAST_THRESHOLD_ExplicitlySet = pcVar1 != (char *)0x0;
    if (pcVar1 == (char *)0x0) {
      FAST_THRESHOLD = Nthreads * 2;
    }
    else {
      lVar2 = strtol(pcVar1,(char **)0x0,0);
      FAST_THRESHOLD = (int)lVar2;
    }
    if (-1 < FAST_THRESHOLD) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid DEPSPAWN_TASK_QUEUE_LIMIT");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

EnvInitClass::EnvInitClass()
    {
      const char *env_var = getenv("DEPSPAWN_NUM_THREADS");
      Nthreads = (env_var == nullptr) ? std::thread::hardware_concurrency() : strtol(env_var, 0, 0);
      if (Nthreads <= 0) {
        throw std::invalid_argument("Invalid DEPSPAWN_NUM_THREADS");
      }

      // since set_threads sets a default set_task_queue_limit
      //we call it here in case DEPSPAWN_TASK_QUEUE_LIMIT modifies it also
      set_threads(Nthreads);
      
      env_var = getenv("DEPSPAWN_ENQUEUE_TASKS");
      EnqueueTasks = (env_var != nullptr);

#ifdef DEPSPAWN_FAST_START
      env_var = getenv("DEPSPAWN_TASK_QUEUE_LIMIT");
      FAST_THRESHOLD_ExplicitlySet = (env_var != nullptr);
      FAST_THRESHOLD = FAST_THRESHOLD_ExplicitlySet ? strtol(env_var, 0, 0) : (Nthreads * 2);
      if (FAST_THRESHOLD < 0) {
        throw std::invalid_argument("Invalid DEPSPAWN_TASK_QUEUE_LIMIT");
      }
#endif
    }